

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O3

void __thiscall cursespp::AppLayout::OnLayout(AppLayout *this)

{
  size_t sVar1;
  size_t sVar2;
  element_type *peVar3;
  element_type *peVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  _func_int **pp_Var8;
  
  iVar5 = Screen::GetWidth();
  sVar1 = this->paddingL;
  sVar2 = this->paddingR;
  iVar6 = Screen::GetHeight();
  peVar3 = (this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar3 != (element_type *)0x0) {
    uVar7 = (uint)this->paddingT;
    (*(peVar3->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x15])
              (peVar3,(ulong)(uint)this->paddingL,(ulong)uVar7,
               (ulong)(uint)(iVar5 - ((int)sVar2 + (int)sVar1)),
               (ulong)(iVar6 - ((int)this->paddingB + uVar7 + (this->autoHideCommandBar ^ 1))));
    (*(((this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x2b])();
    (*(((this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[2])();
  }
  peVar4 = (this->shortcuts).
           super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = Screen::GetHeight();
  uVar7 = Screen::GetWidth();
  (*(peVar4->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x15])
            (peVar4,0,(ulong)(iVar5 - 1),(ulong)uVar7,1);
  pp_Var8 = (((this->shortcuts).
              super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Window).super_IWindow.super_IOrderable._vptr_IOrderable;
  if (this->autoHideCommandBar == true) {
    iVar5 = (*pp_Var8[0x24])();
    pp_Var8 = (((this->shortcuts).
                super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Window).super_IWindow.super_IOrderable._vptr_IOrderable;
    if ((char)iVar5 == '\0') {
      pp_Var8 = pp_Var8 + 0x2c;
    }
    else {
      (*pp_Var8[0x2b])();
      pp_Var8 = (((this->shortcuts).
                  super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable + 2;
    }
  }
  else {
    pp_Var8 = pp_Var8 + 0x2b;
  }
  (**pp_Var8)();
  return;
}

Assistant:

void AppLayout::OnLayout() {
    const int cx = Screen::GetWidth() - (paddingL + paddingR);
    const int cy = Screen::GetHeight() - (paddingT + paddingB);

#if ENABLE_DEMO_MODE
    this->hotkey->MoveAndResize(0, cy - 1, cx, 1);
    --cy;
#endif

    const int mainCyOffset = this->autoHideCommandBar ? 0 : 1;

    if (this->layout) {
        this->layout->MoveAndResize(paddingL, paddingT, cx, cy - mainCyOffset);
        this->layout->Show();
        this->layout->BringToTop();
    }

    this->shortcuts->MoveAndResize(
        0, Screen::GetHeight() - 1, Screen::GetWidth(), 1);

    if (this->autoHideCommandBar) {
        if (this->shortcuts->IsFocused()) {
            this->shortcuts->Show();
            this->shortcuts->BringToTop();
        }
        else {
            this->shortcuts->Hide();
        }
    }
    else {
        this->shortcuts->Show();
    }
}